

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void __thiscall Stat_scancycles::~Stat_scancycles(Stat_scancycles *this)

{
  Stat_scancycles *this_local;
  
  ~Stat_scancycles(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

ADD_STAT (scancycles)
{
	FString out;
	double scancycles = WallScanCycles.Time();
	if (scancycles && scancycles < bestscancycles)
		bestscancycles = scancycles;
	out.Format ("%g", bestscancycles);
	return out;
}